

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::GatherBase::IsFloatingPointTexture(GatherBase *this,GLenum internal_format)

{
  GLenum internal_format_local;
  GatherBase *this_local;
  
  if ((((internal_format == 0x822e) || (internal_format == 0x8230)) ||
      (internal_format - 0x8814 < 2)) || (internal_format == 0x8cac)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsFloatingPointTexture(GLenum internal_format)
	{
		switch (internal_format)
		{
		case GL_R32F:
		case GL_RG32F:
		case GL_RGB32F:
		case GL_RGBA32F:
		case GL_DEPTH_COMPONENT32F:
			return true;
		}

		return false;
	}